

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

int emit_table_size(nghttp2_bufs *bufs,size_t table_size)

{
  int iVar1;
  size_t len;
  uint8_t sb [16];
  
  len = count_encoded_length(table_size,5);
  iVar1 = -0x20b;
  if (len < 0x11) {
    sb[0] = ' ';
    encode_length(sb,table_size,5);
    iVar1 = nghttp2_bufs_add(bufs,sb,len);
  }
  return iVar1;
}

Assistant:

static int emit_table_size(nghttp2_bufs *bufs, size_t table_size) {
  int rv;
  uint8_t *bufp;
  size_t blocklen;
  uint8_t sb[16];

  DEBUGF("deflatehd: emit table_size=%zu\n", table_size);

  blocklen = count_encoded_length(table_size, 5);

  if (sizeof(sb) < blocklen) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  bufp = sb;

  *bufp = 0x20u;

  encode_length(bufp, table_size, 5);

  rv = nghttp2_bufs_add(bufs, sb, blocklen);
  if (rv != 0) {
    return rv;
  }

  return 0;
}